

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

Net * __thiscall notch::core::MakeNet::make(Net *__return_storage_ptr__,MakeNet *this)

{
  LayerType LVar1;
  pointer pMVar2;
  logic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar3;
  ulong uVar4;
  undefined1 local_d8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  shared_ptr<notch::core::ALossLayer> local_98;
  shared_ptr<notch::core::ABackpropLayer> local_88;
  shared_ptr<notch::core::ABackpropLayer> local_78;
  value_type lmaker;
  
  local_d8._24_8_ = __return_storage_ptr__;
  Net::Net(__return_storage_ptr__);
  lVar3 = 0;
  for (uVar4 = 0;
      pMVar2 = (this->layerMakers).
               super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->layerMakers).
                             super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x38);
      uVar4 = uVar4 + 1) {
    LVar1 = (this->layerTypes).
            super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar4];
    MakeLayer::MakeLayer(&lmaker,(MakeLayer *)((long)&pMVar2->nInputs + lVar3));
    switch(LVar1) {
    case FC:
      MakeLayer::FC((MakeLayer *)local_d8);
      local_78.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_78.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Net::append((Net *)local_d8._24_8_,&local_78);
      this_01 = &local_78.
                 super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case Activation:
      MakeLayer::activation((MakeLayer *)local_d8);
      local_88.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_88.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Net::append((Net *)local_d8._24_8_,&local_88);
      this_01 = &local_88.
                 super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case L2Loss:
      MakeLayer::L2Loss((MakeLayer *)local_d8);
      local_98.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_98.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Net::append((Net *)local_d8._24_8_,&local_98);
      this_01 = &local_98.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      break;
    case Softmax:
      MakeLayer::softmax((MakeLayer *)local_d8);
      local_d8._48_8_ = local_d8._0_8_;
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Net::append((Net *)local_d8._24_8_,(shared_ptr<notch::core::ALossLayer> *)(local_d8 + 0x30));
      this_01 = &_Stack_a0;
      break;
    case Hinge:
      MakeLayer::hinge((MakeLayer *)local_d8);
      local_d8._32_8_ = local_d8._0_8_;
      local_d8._40_8_ = local_d8._8_8_;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Net::append((Net *)local_d8._24_8_,(shared_ptr<notch::core::ALossLayer> *)(local_d8 + 0x20));
      this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x28);
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      ::std::logic_error::logic_error(this_00,"unsupported layer type");
      __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    MakeLayer::~MakeLayer(&lmaker);
    lVar3 = lVar3 + 0x38;
  }
  return (Net *)local_d8._24_8_;
}

Assistant:

Net make() {
        Net net;
        for (size_t i = 0; i < layerMakers.size(); ++i) {
            auto ltype = layerTypes[i];
            auto lmaker = layerMakers[i];
            switch (ltype) {
                case LayerType::FC:
                    net.append(lmaker.FC()); break;
                case LayerType::Activation:
                    net.append(lmaker.activation()); break;
                case LayerType::L2Loss:
                    net.append(lmaker.L2Loss()); break;
                case LayerType::Softmax:
                    net.append(lmaker.softmax()); break;
                case LayerType::Hinge:
                    net.append(lmaker.hinge()); break;
                default:
                    throw std::logic_error("unsupported layer type"); break;
            }
        }
        return net;
    }